

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmtable.cpp
# Opt level: O0

void __thiscall icu_63::Formattable::setString(Formattable *this,UnicodeString *stringToCopy)

{
  UnicodeString *pUVar1;
  UnicodeString *local_38;
  UnicodeString *stringToCopy_local;
  Formattable *this_local;
  
  pUVar1 = stringToCopy;
  dispose(this);
  this->fType = kString;
  pUVar1 = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,(size_t)pUVar1);
  local_38 = (UnicodeString *)0x0;
  if (pUVar1 != (UnicodeString *)0x0) {
    UnicodeString::UnicodeString(pUVar1,stringToCopy);
    local_38 = pUVar1;
  }
  (this->fValue).fObject = (UObject *)local_38;
  return;
}

Assistant:

void
Formattable::setString(const UnicodeString& stringToCopy)
{
    dispose();
    fType = kString;
    fValue.fString = new UnicodeString(stringToCopy);
}